

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O3

ulint __thiscall bwtil::fid_cgap::serialize(fid_cgap *this,ostream *out)

{
  pointer pbVar1;
  ulong uVar2;
  ostream *out_00;
  ulong uVar3;
  ulint uVar4;
  long lVar5;
  pointer pbVar6;
  ulint v_sel_size;
  ulint bsds_size;
  bool b;
  long local_108;
  ostream *local_100;
  long local_f8;
  bsd_cgap local_f0;
  
  uVar4 = 8;
  ::std::ostream::write((char *)out,(long)this);
  if (this->W != 0) {
    ::std::ostream::write((char *)out,(long)&this->u);
    ::std::ostream::write((char *)out,(long)&this->n);
    ::std::ostream::write((char *)out,(long)&this->v);
    ::std::ostream::write((char *)out,(long)&this->t);
    ::std::ostream::write((char *)out,(long)&this->number_of_v_blocks);
    ::std::ostream::write((char *)out,(long)&this->number_of_t_blocks);
    local_108 = (long)(this->V_select).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->V_select).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
    ::std::ostream::write((char *)out,(long)&local_108);
    local_f8 = ((long)(this->BSDs).
                      super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->BSDs).
                      super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl.
                      super__Vector_impl_data._M_start >> 6) * -0x5555555555555555;
    ::std::ostream::write((char *)out,(long)&local_f8);
    local_100 = out;
    cgap_dictionary::serialize(&this->D,out);
    out_00 = local_100;
    if (this->number_of_v_blocks == 0) {
      uVar2 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar2 = uVar3 + 0x3f;
        if (-1 < (long)uVar3) {
          uVar2 = uVar3;
        }
        local_f0.D = (cgap_dictionary *)
                     CONCAT71(local_f0.D._1_7_,
                              ((this->V).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [((long)uVar2 >> 6) +
                                (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) +
                                0xffffffffffffffff] >> (uVar3 & 0x3f) & 1) != 0);
        ::std::ostream::write((char *)out_00,(long)&local_f0);
        uVar2 = this->number_of_v_blocks;
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    ::std::ostream::write
              ((char *)out_00,
               (long)(this->V_rank).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    uVar4 = this->number_of_v_blocks;
    ::std::ostream::write
              ((char *)out_00,
               (long)(this->V_select).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    lVar5 = uVar4 + local_108;
    ::std::ostream::write
              ((char *)out_00,
               (long)(this->R).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    uVar4 = this->number_of_v_blocks;
    ::std::ostream::write
              ((char *)out_00,
               (long)(this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    lVar5 = uVar2 + 0x40 + (lVar5 + uVar4 + local_108) * 8;
    pbVar6 = (this->BSDs).super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->BSDs).super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar1) {
      do {
        local_f0.D = pbVar6->D;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_f0.C._container,&(pbVar6->C)._container);
        local_f0.W = pbVar6->W;
        local_f0._33_7_ = *(undefined7 *)&pbVar6->field_0x21;
        local_f0.c = pbVar6->c;
        local_f0.logc = pbVar6->logc;
        local_f0.logu = pbVar6->logu;
        local_f0._50_6_ = *(undefined6 *)&pbVar6->field_0x32;
        local_f0.tail = pbVar6->tail;
        local_f0.u = pbVar6->u;
        local_f0.n = pbVar6->n;
        local_f0.t = pbVar6->t;
        local_f0._84_4_ = *(undefined4 *)&pbVar6->field_0x54;
        local_f0.number_of_blocks = pbVar6->number_of_blocks;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0.first_el,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pbVar6->first_el);
        local_f0.first_el._field_mask = (pbVar6->first_el)._field_mask;
        local_f0.first_el._size = (pbVar6->first_el)._size;
        local_f0.first_el._width = (pbVar6->first_el)._width;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0.C_addr,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pbVar6->C_addr);
        local_f0.C_addr._field_mask = (pbVar6->C_addr)._field_mask;
        local_f0.C_addr._size = (pbVar6->C_addr)._size;
        local_f0.C_addr._width = (pbVar6->C_addr)._width;
        uVar4 = bsd_cgap::serialize(&local_f0,out_00);
        if (local_f0.C_addr._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.C_addr._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_f0.first_el._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.first_el._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_f0.C._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.C._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        lVar5 = lVar5 + uVar4;
        pbVar6 = pbVar6 + 1;
        out_00 = local_100;
      } while (pbVar6 != pbVar1);
    }
    ::std::ostream::write
              ((char *)out_00,
               (long)(this->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    uVar4 = lVar5 + this->number_of_t_blocks * 8;
  }
  return uVar4;
}

Assistant:

ulint serialize(std::ostream& out){

		out.write((char *)&W, sizeof(ulint));

		if(W==0) return sizeof(ulint);

		out.write((char *)&u, sizeof(ulint));
		out.write((char *)&n, sizeof(ulint));
		out.write((char *)&v, sizeof(ulint));
		out.write((char *)&t, sizeof(ulint));
		out.write((char *)&number_of_v_blocks, sizeof(ulint));
		out.write((char *)&number_of_t_blocks, sizeof(ulint));

		ulint v_sel_size = V_select.size();
		out.write((char *)&v_sel_size, sizeof(ulint));

		ulint bsds_size = BSDs.size();
		out.write((char *)&bsds_size, sizeof(ulint));

		ulint w_bytes = 8*sizeof(ulint);

		D.serialize(out);

		for(ulint i=0;i<number_of_v_blocks;++i){
			bool b = V[i];
			out.write((char *)&b, sizeof(bool));
		}

		w_bytes += number_of_v_blocks*sizeof(bool);

		out.write((char *)V_rank.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)V_select.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		out.write((char *)R.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)R_1.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		for(auto bsd : BSDs)
			w_bytes += bsd.serialize(out);

		out.write((char *)SEL.data(), number_of_t_blocks*sizeof(ulint));
		w_bytes += number_of_t_blocks*sizeof(ulint);

		return w_bytes;

	}